

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.h
# Opt level: O2

int __thiscall
kj::FunctionParam<int_(char,_bool)>::
Wrapper<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/function-test.c++:138:36)>
::operator()(Wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_function_test_c__:138:36)>
             *this,char params,bool params_1)

{
  anon_class_4_1_54a39809 *paVar1;
  char local_4a;
  char local_49;
  DebugComparison<char_&,_char> _kjCondition;
  
  paVar1 = this->func;
  _kjCondition.left = &local_49;
  _kjCondition.result = params == 'x';
  _kjCondition.right = 'x';
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  local_4a = params_1;
  local_49 = params;
  if (kj::_::Debug::minSeverity < 3 && !_kjCondition.result) {
    kj::_::Debug::log<char_const(&)[26],kj::_::DebugComparison<char&,char>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/function-test.c++"
               ,0x8b,ERROR,"\"failed: expected \" \"c == \'x\'\", _kjCondition",
               (char (*) [26])"failed: expected c == \'x\'",&_kjCondition);
  }
  _kjCondition.left = &local_4a;
  if (!params_1 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[19],kj::_::DebugExpression<bool&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/function-test.c++"
               ,0x8c,ERROR,"\"failed: expected \" \"b\", _kjCondition",
               (char (*) [19])"failed: expected b",(DebugExpression<bool_&> *)&_kjCondition);
  }
  _kjCondition.result = paVar1->i == 0x7b;
  _kjCondition.right = '{';
  _kjCondition._9_3_ = 0;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if ((!_kjCondition.result) && (kj::_::Debug::minSeverity < 3)) {
    _kjCondition.left = (char *)paVar1;
    kj::_::Debug::log<char_const(&)[26],kj::_::DebugComparison<int_const&,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/function-test.c++"
               ,0x8d,ERROR,"\"failed: expected \" \"i == 123\", _kjCondition",
               (char (*) [26])"failed: expected i == 123",
               (DebugComparison<const_int_&,_int> *)&_kjCondition);
  }
  return 0x1c8;
}

Assistant:

inline Return operator()(Params... params) override {
      return func(kj::fwd<Params>(params)...);
    }